

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O2

VerticalAlign
Rml::ComputeVerticalAlign
          (Property *property,float line_height,float font_size,float document_font_size,
          float dp_ratio,Vector2f vp_dimensions)

{
  Unit UVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  NumericValue value;
  ulong uVar5;
  float fVar6;
  
  UVar1 = property->unit;
  if ((UVar1 & LENGTH) == UNKNOWN) {
    if (UVar1 != KEYWORD) {
      if (UVar1 == PERCENT) {
        fVar6 = Property::Get<float>(property);
        fVar6 = fVar6 * line_height * 0.01;
        goto LAB_00254c05;
      }
      bVar3 = Assert("RMLUI_ASSERT(property->unit == Unit::KEYWORD)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ComputeProperty.cpp"
                     ,0xc6);
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
    }
    uVar4 = Property::Get<int>(property);
    uVar5 = (ulong)(uVar4 & 0xff);
    fVar6 = 0.0;
  }
  else {
    value = Property::GetNumericValue(property);
    fVar6 = ComputeLength(value,font_size,document_font_size,dp_ratio,vp_dimensions);
LAB_00254c05:
    uVar5 = 9;
  }
  return (VerticalAlign)((ulong)(uint)fVar6 << 0x20 | uVar5);
}

Assistant:

Style::VerticalAlign ComputeVerticalAlign(const Property* property, float line_height, float font_size, float document_font_size, float dp_ratio,
	Vector2f vp_dimensions)
{
	if (Any(property->unit & Unit::LENGTH))
	{
		float value = ComputeLength(property->GetNumericValue(), font_size, document_font_size, dp_ratio, vp_dimensions);
		return Style::VerticalAlign(value);
	}
	else if (property->unit == Unit::PERCENT)
	{
		return Style::VerticalAlign(property->Get<float>() * line_height * 0.01f);
	}

	RMLUI_ASSERT(property->unit == Unit::KEYWORD);
	return Style::VerticalAlign((Style::VerticalAlign::Type)property->Get<int>());
}